

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSearchPath::SchemaInSearchPath
          (CatalogSearchPath *this,ClientContext *context,string *catalog_name,string *schema_name)

{
  pointer pCVar1;
  bool bVar2;
  string *l2;
  CatalogSearchEntry *path;
  pointer l1;
  
  pCVar1 = (this->paths).
           super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
           super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (l1 = (this->paths).
            super_vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>.
            super__Vector_base<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>
            ._M_impl.super__Vector_impl_data._M_start; l1 != pCVar1; l1 = l1 + 1) {
    bVar2 = StringUtil::CIEquals((string *)&l1->schema,(string *)schema_name);
    if (bVar2) {
      bVar2 = StringUtil::CIEquals((string *)l1,(string *)catalog_name);
      if (bVar2) break;
      bVar2 = IsInvalidCatalog((string *)l1);
      if (bVar2) {
        l2 = DatabaseManager::GetDefaultDatabase_abi_cxx11_(context);
        bVar2 = StringUtil::CIEquals((string *)catalog_name,(string *)l2);
        if (bVar2) break;
      }
    }
  }
  return l1 != pCVar1;
}

Assistant:

bool CatalogSearchPath::SchemaInSearchPath(ClientContext &context, const string &catalog_name,
                                           const string &schema_name) const {
	for (auto &path : paths) {
		if (!StringUtil::CIEquals(path.schema, schema_name)) {
			continue;
		}
		if (StringUtil::CIEquals(path.catalog, catalog_name)) {
			return true;
		}
		if (IsInvalidCatalog(path.catalog) &&
		    StringUtil::CIEquals(catalog_name, DatabaseManager::GetDefaultDatabase(context))) {
			return true;
		}
	}
	return false;
}